

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O2

Utest * __thiscall
TEST_WiningStateTest_EarthlyHand_TestShell::createTest
          (TEST_WiningStateTest_EarthlyHand_TestShell *this)

{
  TEST_WiningStateTest_EarthlyHand_Test *this_00;
  
  this_00 = (TEST_WiningStateTest_EarthlyHand_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
                         ,0x122);
  TEST_WiningStateTest_EarthlyHand_Test::TEST_WiningStateTest_EarthlyHand_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(WiningStateTest, EarthlyHand)
{
	s.setSeatWind(Tile::SouthWind);

	addNoWiningHand();

	SelfDrawnSituation situation;
	situation.is_uninterrupted_first_drawn = true;

	selfDrawn(situation);
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::EarthlyHand));
	CHECK_EQUAL(100, r.doubling_factor);
}